

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_8.c
# Opt level: O0

void arr_store_col(int *col,__m256i vH,int32_t t,int32_t seglen,int32_t bias)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_YMM0_H;
  undefined1 local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  local_60 = (char)in_XMM0_Qa;
  *(int *)(in_RDI + (long)in_ESI * 4) = local_60 - in_ECX;
  uStack_5f = (char)((ulong)in_XMM0_Qa >> 8);
  *(int *)(in_RDI + (long)(in_EDX + in_ESI) * 4) = uStack_5f - in_ECX;
  uStack_5e = (char)((ulong)in_XMM0_Qa >> 0x10);
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 2) * 4) = uStack_5e - in_ECX;
  uStack_5d = (char)((ulong)in_XMM0_Qa >> 0x18);
  *(int *)(in_RDI + (long)(in_EDX * 3 + in_ESI) * 4) = uStack_5d - in_ECX;
  uStack_5c = (char)((ulong)in_XMM0_Qa >> 0x20);
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 4) * 4) = uStack_5c - in_ECX;
  uStack_5b = (char)((ulong)in_XMM0_Qa >> 0x28);
  *(int *)(in_RDI + (long)(in_EDX * 5 + in_ESI) * 4) = uStack_5b - in_ECX;
  uStack_5a = (char)((ulong)in_XMM0_Qa >> 0x30);
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 6) * 4) = uStack_5a - in_ECX;
  uStack_59 = (char)((ulong)in_XMM0_Qa >> 0x38);
  *(int *)(in_RDI + (long)(in_EDX * 7 + in_ESI) * 4) = uStack_59 - in_ECX;
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 8) * 4) = local_60 - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 9 + in_ESI) * 4) = uStack_5f - in_ECX;
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 10) * 4) = uStack_5e - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0xb + in_ESI) * 4) = uStack_5d - in_ECX;
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 0xc) * 4) = uStack_5c - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0xd + in_ESI) * 4) = uStack_5b - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0xe + in_ESI) * 4) = uStack_5a - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0xf + in_ESI) * 4) = uStack_59 - in_ECX;
  uStack_50 = (char)in_YMM0_H;
  *(int *)(in_RDI + (long)(in_EDX * 0x10 + in_ESI) * 4) = uStack_50 - in_ECX;
  uStack_4f = (char)((ulong)in_YMM0_H >> 8);
  *(int *)(in_RDI + (long)(in_EDX * 0x11 + in_ESI) * 4) = uStack_4f - in_ECX;
  uStack_4e = (char)((ulong)in_YMM0_H >> 0x10);
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 0x12) * 4) = uStack_4e - in_ECX;
  uStack_4d = (char)((ulong)in_YMM0_H >> 0x18);
  *(int *)(in_RDI + (long)(in_EDX * 0x13 + in_ESI) * 4) = uStack_4d - in_ECX;
  uStack_4c = (char)((ulong)in_YMM0_H >> 0x20);
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 0x14) * 4) = uStack_4c - in_ECX;
  uStack_4b = (char)((ulong)in_YMM0_H >> 0x28);
  *(int *)(in_RDI + (long)(in_EDX * 0x15 + in_ESI) * 4) = uStack_4b - in_ECX;
  uStack_4a = (char)((ulong)in_YMM0_H >> 0x30);
  *(int *)(in_RDI + (long)(in_EDX * 0x16 + in_ESI) * 4) = uStack_4a - in_ECX;
  uStack_49 = (char)((ulong)in_YMM0_H >> 0x38);
  *(int *)(in_RDI + (long)(in_EDX * 0x17 + in_ESI) * 4) = uStack_49 - in_ECX;
  *(int *)(in_RDI + (long)(in_ESI + in_EDX * 0x18) * 4) = uStack_50 - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x19 + in_ESI) * 4) = uStack_4f - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1a + in_ESI) * 4) = uStack_4e - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1b + in_ESI) * 4) = uStack_4d - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1c + in_ESI) * 4) = uStack_4c - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1d + in_ESI) * 4) = uStack_4b - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1e + in_ESI) * 4) = uStack_4a - in_ECX;
  *(int *)(in_RDI + (long)(in_EDX * 0x1f + in_ESI) * 4) = uStack_49 - in_ECX;
  return;
}

Assistant:

static inline void arr_store_col(
        int *col,
        __m128i vH,
        int32_t t,
        int32_t seglen,
        int32_t bias)
{
    col[ 0*seglen+t] = (int8_t)_mm_extract_epi8(vH,  0) - bias;
    col[ 1*seglen+t] = (int8_t)_mm_extract_epi8(vH,  1) - bias;
    col[ 2*seglen+t] = (int8_t)_mm_extract_epi8(vH,  2) - bias;
    col[ 3*seglen+t] = (int8_t)_mm_extract_epi8(vH,  3) - bias;
    col[ 4*seglen+t] = (int8_t)_mm_extract_epi8(vH,  4) - bias;
    col[ 5*seglen+t] = (int8_t)_mm_extract_epi8(vH,  5) - bias;
    col[ 6*seglen+t] = (int8_t)_mm_extract_epi8(vH,  6) - bias;
    col[ 7*seglen+t] = (int8_t)_mm_extract_epi8(vH,  7) - bias;
    col[ 8*seglen+t] = (int8_t)_mm_extract_epi8(vH,  8) - bias;
    col[ 9*seglen+t] = (int8_t)_mm_extract_epi8(vH,  9) - bias;
    col[10*seglen+t] = (int8_t)_mm_extract_epi8(vH, 10) - bias;
    col[11*seglen+t] = (int8_t)_mm_extract_epi8(vH, 11) - bias;
    col[12*seglen+t] = (int8_t)_mm_extract_epi8(vH, 12) - bias;
    col[13*seglen+t] = (int8_t)_mm_extract_epi8(vH, 13) - bias;
    col[14*seglen+t] = (int8_t)_mm_extract_epi8(vH, 14) - bias;
    col[15*seglen+t] = (int8_t)_mm_extract_epi8(vH, 15) - bias;
}